

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void idct32_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in1_15;
  __m256i in1_16;
  __m256i in1_17;
  __m256i in1_18;
  __m256i in1_19;
  __m256i in1_20;
  __m256i in1_21;
  __m256i in1_22;
  __m256i in1_23;
  __m256i in1_24;
  __m256i in1_25;
  __m256i in1_26;
  __m256i in1_27;
  __m256i in1_28;
  __m256i in1_29;
  __m256i in1_30;
  __m256i in1_31;
  __m256i in1_32;
  __m256i in1_33;
  __m256i in1_34;
  __m256i in1_35;
  __m256i in1_36;
  __m256i in1_37;
  __m256i in1_38;
  __m256i in1_39;
  __m256i in1_40;
  __m256i in1_41;
  __m256i in1_42;
  __m256i in1_43;
  __m256i in1_44;
  __m256i in1_45;
  __m256i in1_46;
  __m256i in1_47;
  __m256i in1_48;
  __m256i in1_49;
  __m256i in1_50;
  __m256i in1_51;
  __m256i in1_52;
  __m256i in1_53;
  __m256i in1_54;
  __m256i in1_55;
  __m256i in1_56;
  __m256i in1_57;
  __m256i in1_58;
  __m256i in1_59;
  __m256i in1_60;
  __m256i in1_61;
  __m256i in1_62;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  __m256i in0_15;
  __m256i in0_16;
  __m256i in0_17;
  __m256i in0_18;
  __m256i in0_19;
  __m256i in0_20;
  __m256i in0_21;
  __m256i in0_22;
  __m256i in0_23;
  __m256i in0_24;
  __m256i in0_25;
  __m256i in0_26;
  __m256i in0_27;
  __m256i in0_28;
  __m256i in0_29;
  __m256i in0_30;
  __m256i in0_31;
  __m256i in0_32;
  __m256i in0_33;
  __m256i in0_34;
  __m256i in0_35;
  __m256i in0_36;
  __m256i in0_37;
  __m256i in0_38;
  __m256i in0_39;
  __m256i in0_40;
  __m256i in0_41;
  __m256i in0_42;
  __m256i in0_43;
  __m256i in0_44;
  __m256i in0_45;
  __m256i in0_46;
  __m256i in0_47;
  __m256i in0_48;
  __m256i in0_49;
  __m256i in0_50;
  __m256i in0_51;
  __m256i in0_52;
  __m256i in0_53;
  __m256i in0_54;
  __m256i in0_55;
  __m256i in0_56;
  __m256i in0_57;
  __m256i in0_58;
  __m256i in0_59;
  __m256i in0_60;
  __m256i in0_61;
  __m256i in0_62;
  uint size;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int32_t *piVar11;
  int in_ECX;
  uint uVar12;
  int in_EDX;
  int in_R8D;
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i bf0 [32];
  __m256i bf1 [32];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rounding;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospim48;
  __m256i cospi48;
  __m256i cospim32;
  __m256i cospi32;
  __m256i cospim24;
  __m256i cospim56;
  __m256i cospim8;
  __m256i cospim40;
  __m256i cospi8;
  __m256i cospi40;
  __m256i cospi24;
  __m256i cospi56;
  __m256i cospim4;
  __m256i cospim36;
  __m256i cospim20;
  __m256i cospim52;
  __m256i cospi4;
  __m256i cospi36;
  __m256i cospi20;
  __m256i cospi52;
  __m256i cospi12;
  __m256i cospi44;
  __m256i cospi28;
  __m256i cospi60;
  __m256i cospim2;
  __m256i cospim34;
  __m256i cospim18;
  __m256i cospim50;
  __m256i cospim10;
  __m256i cospim42;
  __m256i cospim26;
  __m256i cospim58;
  __m256i cospi2;
  __m256i cospi34;
  __m256i cospi18;
  __m256i cospi50;
  __m256i cospi10;
  __m256i cospi42;
  __m256i cospi26;
  __m256i cospi58;
  __m256i cospi6;
  __m256i cospi38;
  __m256i cospi22;
  __m256i cospi54;
  __m256i cospi14;
  __m256i cospi46;
  __m256i cospi30;
  __m256i cospi62;
  int32_t *cospi;
  int in_stack_ffffffffffffe0c4;
  __m256i *in_stack_ffffffffffffe0c8;
  char local_1f1c;
  char local_1f10;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint bit_00;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  char local_ef4;
  
  piVar11 = cospi_arr(in_EDX);
  uVar12 = piVar11[0x3e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  vpinsrd_avx(auVar1,uVar12,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  vpinsrd_avx(auVar1,uVar12,3);
  uVar12 = piVar11[0x1e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  vpinsrd_avx(auVar1,uVar12,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar1 = vpinsrd_avx(auVar1,uVar12,2);
  vpinsrd_avx(auVar1,uVar12,3);
  uVar13 = piVar11[0x2e];
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  vpinsrd_avx(auVar1,uVar13,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar13),uVar13,1);
  auVar1 = vpinsrd_avx(auVar1,uVar13,2);
  vpinsrd_avx(auVar1,uVar13,3);
  uVar14 = piVar11[0xe];
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  vpinsrd_avx(auVar1,uVar14,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar14),uVar14,1);
  auVar1 = vpinsrd_avx(auVar1,uVar14,2);
  vpinsrd_avx(auVar1,uVar14,3);
  uVar15 = piVar11[0x36];
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  vpinsrd_avx(auVar1,uVar15,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar15),uVar15,1);
  auVar1 = vpinsrd_avx(auVar1,uVar15,2);
  vpinsrd_avx(auVar1,uVar15,3);
  uVar16 = piVar11[0x16];
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  vpinsrd_avx(auVar1,uVar16,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar16),uVar16,1);
  auVar1 = vpinsrd_avx(auVar1,uVar16,2);
  vpinsrd_avx(auVar1,uVar16,3);
  bit_00 = piVar11[0x26];
  auVar1 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar1 = vpinsrd_avx(auVar1,bit_00,2);
  vpinsrd_avx(auVar1,bit_00,3);
  auVar1 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar1 = vpinsrd_avx(auVar1,bit_00,2);
  vpinsrd_avx(auVar1,bit_00,3);
  uVar17 = piVar11[6];
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  vpinsrd_avx(auVar1,uVar17,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar17),uVar17,1);
  auVar1 = vpinsrd_avx(auVar1,uVar17,2);
  vpinsrd_avx(auVar1,uVar17,3);
  uVar18 = piVar11[0x3a];
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  vpinsrd_avx(auVar1,uVar18,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  vpinsrd_avx(auVar1,uVar18,3);
  uVar19 = piVar11[0x1a];
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  vpinsrd_avx(auVar1,uVar19,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar19),uVar19,1);
  auVar1 = vpinsrd_avx(auVar1,uVar19,2);
  vpinsrd_avx(auVar1,uVar19,3);
  uVar20 = piVar11[0x2a];
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  vpinsrd_avx(auVar1,uVar20,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  vpinsrd_avx(auVar1,uVar20,3);
  uVar21 = piVar11[10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  vpinsrd_avx(auVar1,uVar21,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar21),uVar21,1);
  auVar1 = vpinsrd_avx(auVar1,uVar21,2);
  vpinsrd_avx(auVar1,uVar21,3);
  uVar22 = piVar11[0x32];
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  vpinsrd_avx(auVar1,uVar22,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar1 = vpinsrd_avx(auVar1,uVar22,2);
  vpinsrd_avx(auVar1,uVar22,3);
  uVar23 = piVar11[0x12];
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  vpinsrd_avx(auVar1,uVar23,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar1 = vpinsrd_avx(auVar1,uVar23,2);
  vpinsrd_avx(auVar1,uVar23,3);
  uVar24 = piVar11[0x22];
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  vpinsrd_avx(auVar1,uVar24,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar1 = vpinsrd_avx(auVar1,uVar24,2);
  vpinsrd_avx(auVar1,uVar24,3);
  uVar25 = piVar11[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar1 = vpinsrd_avx(auVar1,uVar25,2);
  vpinsrd_avx(auVar1,uVar25,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar1 = vpinsrd_avx(auVar1,uVar25,2);
  vpinsrd_avx(auVar1,uVar25,3);
  size = -piVar11[0x3a];
  auVar1 = vpinsrd_avx(ZEXT416(size),size,1);
  auVar1 = vpinsrd_avx(auVar1,size,2);
  vpinsrd_avx(auVar1,size,3);
  auVar1 = vpinsrd_avx(ZEXT416(size),size,1);
  auVar1 = vpinsrd_avx(auVar1,size,2);
  vpinsrd_avx(auVar1,size,3);
  uVar2 = -piVar11[0x1a];
  auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
  auVar1 = vpinsrd_avx(auVar1,uVar2,2);
  vpinsrd_avx(auVar1,uVar2,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar2),uVar2,1);
  auVar1 = vpinsrd_avx(auVar1,uVar2,2);
  vpinsrd_avx(auVar1,uVar2,3);
  uVar3 = -piVar11[0x2a];
  auVar1 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar1 = vpinsrd_avx(auVar1,uVar3,2);
  vpinsrd_avx(auVar1,uVar3,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar3),uVar3,1);
  auVar1 = vpinsrd_avx(auVar1,uVar3,2);
  vpinsrd_avx(auVar1,uVar3,3);
  uVar4 = -piVar11[10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  vpinsrd_avx(auVar1,uVar4,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
  auVar1 = vpinsrd_avx(auVar1,uVar4,2);
  vpinsrd_avx(auVar1,uVar4,3);
  uVar5 = -piVar11[0x32];
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  vpinsrd_avx(auVar1,uVar5,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar1 = vpinsrd_avx(auVar1,uVar5,2);
  vpinsrd_avx(auVar1,uVar5,3);
  uVar6 = -piVar11[0x12];
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  vpinsrd_avx(auVar1,uVar6,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
  auVar1 = vpinsrd_avx(auVar1,uVar6,2);
  vpinsrd_avx(auVar1,uVar6,3);
  uVar7 = -piVar11[0x22];
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  vpinsrd_avx(auVar1,uVar7,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  vpinsrd_avx(auVar1,uVar7,3);
  uVar8 = -piVar11[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar1 = vpinsrd_avx(auVar1,uVar8,2);
  vpinsrd_avx(auVar1,uVar8,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar1 = vpinsrd_avx(auVar1,uVar8,2);
  vpinsrd_avx(auVar1,uVar8,3);
  uVar26 = piVar11[0x3c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar1 = vpinsrd_avx(auVar1,uVar26,2);
  vpinsrd_avx(auVar1,uVar26,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar1 = vpinsrd_avx(auVar1,uVar26,2);
  vpinsrd_avx(auVar1,uVar26,3);
  uVar9 = piVar11[0x1c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x2c];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0xc];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[4];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x34];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x14];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x24];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[4];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x28];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[8];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x38];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x18];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x30];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = piVar11[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = -piVar11[0x10];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  local_ef4 = (char)in_EDX;
  uVar9 = 1 << (local_ef4 - 1U & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  iVar10 = 8;
  if (in_ECX != 0) {
    iVar10 = 6;
  }
  if (in_R8D + iVar10 < 0x10) {
    local_1f10 = '\x10';
  }
  else {
    local_1f10 = '\b';
    if (in_ECX != 0) {
      local_1f10 = '\x06';
    }
    local_1f10 = (char)in_R8D + local_1f10;
  }
  uVar9 = -(1 << (local_1f10 - 1U & 0x1f));
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  uVar9 = (1 << (local_1f10 - 1U & 0x1f)) - 1;
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  vpinsrd_avx(auVar1,uVar9,3);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0[0]._4_4_ = uVar3;
  in0[0]._0_4_ = uVar2;
  in0[1]._0_4_ = uVar4;
  in0[1]._4_4_ = uVar5;
  in0[2]._0_4_ = uVar6;
  in0[2]._4_4_ = uVar7;
  in0[3]._0_4_ = uVar8;
  in0[3]._4_4_ = uVar26;
  in1[0]._4_4_ = uVar20;
  in1[0]._0_4_ = uVar19;
  in1[1]._0_4_ = uVar21;
  in1[1]._4_4_ = uVar22;
  in1[2]._0_4_ = uVar23;
  in1[2]._4_4_ = uVar24;
  in1[3]._0_4_ = uVar25;
  in1[3]._4_4_ = size;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_00[0]._4_4_ = uVar3;
  in0_00[0]._0_4_ = uVar2;
  in0_00[1]._0_4_ = uVar4;
  in0_00[1]._4_4_ = uVar5;
  in0_00[2]._0_4_ = uVar6;
  in0_00[2]._4_4_ = uVar7;
  in0_00[3]._0_4_ = uVar8;
  in0_00[3]._4_4_ = uVar26;
  in1_00[0]._4_4_ = uVar20;
  in1_00[0]._0_4_ = uVar19;
  in1_00[1]._0_4_ = uVar21;
  in1_00[1]._4_4_ = uVar22;
  in1_00[2]._0_4_ = uVar23;
  in1_00[2]._4_4_ = uVar24;
  in1_00[3]._0_4_ = uVar25;
  in1_00[3]._4_4_ = size;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_01[0]._4_4_ = uVar3;
  in0_01[0]._0_4_ = uVar2;
  in0_01[1]._0_4_ = uVar4;
  in0_01[1]._4_4_ = uVar5;
  in0_01[2]._0_4_ = uVar6;
  in0_01[2]._4_4_ = uVar7;
  in0_01[3]._0_4_ = uVar8;
  in0_01[3]._4_4_ = uVar26;
  in1_01[0]._4_4_ = uVar20;
  in1_01[0]._0_4_ = uVar19;
  in1_01[1]._0_4_ = uVar21;
  in1_01[1]._4_4_ = uVar22;
  in1_01[2]._0_4_ = uVar23;
  in1_01[2]._4_4_ = uVar24;
  in1_01[3]._0_4_ = uVar25;
  in1_01[3]._4_4_ = size;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_02[0]._4_4_ = uVar3;
  in0_02[0]._0_4_ = uVar2;
  in0_02[1]._0_4_ = uVar4;
  in0_02[1]._4_4_ = uVar5;
  in0_02[2]._0_4_ = uVar6;
  in0_02[2]._4_4_ = uVar7;
  in0_02[3]._0_4_ = uVar8;
  in0_02[3]._4_4_ = uVar26;
  in1_02[0]._4_4_ = uVar20;
  in1_02[0]._0_4_ = uVar19;
  in1_02[1]._0_4_ = uVar21;
  in1_02[1]._4_4_ = uVar22;
  in1_02[2]._0_4_ = uVar23;
  in1_02[2]._4_4_ = uVar24;
  in1_02[3]._0_4_ = uVar25;
  in1_02[3]._4_4_ = size;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_03[0]._4_4_ = uVar3;
  in0_03[0]._0_4_ = uVar2;
  in0_03[1]._0_4_ = uVar4;
  in0_03[1]._4_4_ = uVar5;
  in0_03[2]._0_4_ = uVar6;
  in0_03[2]._4_4_ = uVar7;
  in0_03[3]._0_4_ = uVar8;
  in0_03[3]._4_4_ = uVar26;
  in1_03[0]._4_4_ = uVar20;
  in1_03[0]._0_4_ = uVar19;
  in1_03[1]._0_4_ = uVar21;
  in1_03[1]._4_4_ = uVar22;
  in1_03[2]._0_4_ = uVar23;
  in1_03[2]._4_4_ = uVar24;
  in1_03[3]._0_4_ = uVar25;
  in1_03[3]._4_4_ = size;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_04[0]._4_4_ = uVar3;
  in0_04[0]._0_4_ = uVar2;
  in0_04[1]._0_4_ = uVar4;
  in0_04[1]._4_4_ = uVar5;
  in0_04[2]._0_4_ = uVar6;
  in0_04[2]._4_4_ = uVar7;
  in0_04[3]._0_4_ = uVar8;
  in0_04[3]._4_4_ = uVar26;
  in1_04[0]._4_4_ = uVar20;
  in1_04[0]._0_4_ = uVar19;
  in1_04[1]._0_4_ = uVar21;
  in1_04[1]._4_4_ = uVar22;
  in1_04[2]._0_4_ = uVar23;
  in1_04[2]._4_4_ = uVar24;
  in1_04[3]._0_4_ = uVar25;
  in1_04[3]._4_4_ = size;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_05[0]._4_4_ = uVar3;
  in0_05[0]._0_4_ = uVar2;
  in0_05[1]._0_4_ = uVar4;
  in0_05[1]._4_4_ = uVar5;
  in0_05[2]._0_4_ = uVar6;
  in0_05[2]._4_4_ = uVar7;
  in0_05[3]._0_4_ = uVar8;
  in0_05[3]._4_4_ = uVar26;
  in1_05[0]._4_4_ = uVar20;
  in1_05[0]._0_4_ = uVar19;
  in1_05[1]._0_4_ = uVar21;
  in1_05[1]._4_4_ = uVar22;
  in1_05[2]._0_4_ = uVar23;
  in1_05[2]._4_4_ = uVar24;
  in1_05[3]._0_4_ = uVar25;
  in1_05[3]._4_4_ = size;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_06[0]._4_4_ = uVar3;
  in0_06[0]._0_4_ = uVar2;
  in0_06[1]._0_4_ = uVar4;
  in0_06[1]._4_4_ = uVar5;
  in0_06[2]._0_4_ = uVar6;
  in0_06[2]._4_4_ = uVar7;
  in0_06[3]._0_4_ = uVar8;
  in0_06[3]._4_4_ = uVar26;
  in1_06[0]._4_4_ = uVar20;
  in1_06[0]._0_4_ = uVar19;
  in1_06[1]._0_4_ = uVar21;
  in1_06[1]._4_4_ = uVar22;
  in1_06[2]._0_4_ = uVar23;
  in1_06[2]._4_4_ = uVar24;
  in1_06[3]._0_4_ = uVar25;
  in1_06[3]._4_4_ = size;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0_07[0]._4_4_ = uVar3;
  in0_07[0]._0_4_ = uVar2;
  in0_07[1]._0_4_ = uVar4;
  in0_07[1]._4_4_ = uVar5;
  in0_07[2]._0_4_ = uVar6;
  in0_07[2]._4_4_ = uVar7;
  in0_07[3]._0_4_ = uVar8;
  in0_07[3]._4_4_ = uVar26;
  in1_07[0]._4_4_ = uVar20;
  in1_07[0]._0_4_ = uVar19;
  in1_07[1]._0_4_ = uVar21;
  in1_07[1]._4_4_ = uVar22;
  in1_07[2]._0_4_ = uVar23;
  in1_07[2]._4_4_ = uVar24;
  in1_07[3]._0_4_ = uVar25;
  in1_07[3]._4_4_ = size;
  addsub_avx2(in0_07,in1_07,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_08[0]._4_4_ = uVar3;
  in0_08[0]._0_4_ = uVar2;
  in0_08[1]._0_4_ = uVar4;
  in0_08[1]._4_4_ = uVar5;
  in0_08[2]._0_4_ = uVar6;
  in0_08[2]._4_4_ = uVar7;
  in0_08[3]._0_4_ = uVar8;
  in0_08[3]._4_4_ = uVar26;
  in1_08[0]._4_4_ = uVar20;
  in1_08[0]._0_4_ = uVar19;
  in1_08[1]._0_4_ = uVar21;
  in1_08[1]._4_4_ = uVar22;
  in1_08[2]._0_4_ = uVar23;
  in1_08[2]._4_4_ = uVar24;
  in1_08[3]._0_4_ = uVar25;
  in1_08[3]._4_4_ = size;
  addsub_avx2(in0_08,in1_08,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_09[0]._4_4_ = uVar3;
  in0_09[0]._0_4_ = uVar2;
  in0_09[1]._0_4_ = uVar4;
  in0_09[1]._4_4_ = uVar5;
  in0_09[2]._0_4_ = uVar6;
  in0_09[2]._4_4_ = uVar7;
  in0_09[3]._0_4_ = uVar8;
  in0_09[3]._4_4_ = uVar26;
  in1_09[0]._4_4_ = uVar20;
  in1_09[0]._0_4_ = uVar19;
  in1_09[1]._0_4_ = uVar21;
  in1_09[1]._4_4_ = uVar22;
  in1_09[2]._0_4_ = uVar23;
  in1_09[2]._4_4_ = uVar24;
  in1_09[3]._0_4_ = uVar25;
  in1_09[3]._4_4_ = size;
  addsub_avx2(in0_09,in1_09,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_10[0]._4_4_ = uVar3;
  in0_10[0]._0_4_ = uVar2;
  in0_10[1]._0_4_ = uVar4;
  in0_10[1]._4_4_ = uVar5;
  in0_10[2]._0_4_ = uVar6;
  in0_10[2]._4_4_ = uVar7;
  in0_10[3]._0_4_ = uVar8;
  in0_10[3]._4_4_ = uVar26;
  in1_10[0]._4_4_ = uVar20;
  in1_10[0]._0_4_ = uVar19;
  in1_10[1]._0_4_ = uVar21;
  in1_10[1]._4_4_ = uVar22;
  in1_10[2]._0_4_ = uVar23;
  in1_10[2]._4_4_ = uVar24;
  in1_10[3]._0_4_ = uVar25;
  in1_10[3]._4_4_ = size;
  addsub_avx2(in0_10,in1_10,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0_11[0]._4_4_ = uVar3;
  in0_11[0]._0_4_ = uVar2;
  in0_11[1]._0_4_ = uVar4;
  in0_11[1]._4_4_ = uVar5;
  in0_11[2]._0_4_ = uVar6;
  in0_11[2]._4_4_ = uVar7;
  in0_11[3]._0_4_ = uVar8;
  in0_11[3]._4_4_ = uVar26;
  in1_11[0]._4_4_ = uVar20;
  in1_11[0]._0_4_ = uVar19;
  in1_11[1]._0_4_ = uVar21;
  in1_11[1]._4_4_ = uVar22;
  in1_11[2]._0_4_ = uVar23;
  in1_11[2]._4_4_ = uVar24;
  in1_11[3]._0_4_ = uVar25;
  in1_11[3]._4_4_ = size;
  addsub_avx2(in0_11,in1_11,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_12[0]._4_4_ = uVar3;
  in0_12[0]._0_4_ = uVar2;
  in0_12[1]._0_4_ = uVar4;
  in0_12[1]._4_4_ = uVar5;
  in0_12[2]._0_4_ = uVar6;
  in0_12[2]._4_4_ = uVar7;
  in0_12[3]._0_4_ = uVar8;
  in0_12[3]._4_4_ = uVar26;
  in1_12[0]._4_4_ = uVar20;
  in1_12[0]._0_4_ = uVar19;
  in1_12[1]._0_4_ = uVar21;
  in1_12[1]._4_4_ = uVar22;
  in1_12[2]._0_4_ = uVar23;
  in1_12[2]._4_4_ = uVar24;
  in1_12[3]._0_4_ = uVar25;
  in1_12[3]._4_4_ = size;
  addsub_avx2(in0_12,in1_12,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0_13[0]._4_4_ = uVar3;
  in0_13[0]._0_4_ = uVar2;
  in0_13[1]._0_4_ = uVar4;
  in0_13[1]._4_4_ = uVar5;
  in0_13[2]._0_4_ = uVar6;
  in0_13[2]._4_4_ = uVar7;
  in0_13[3]._0_4_ = uVar8;
  in0_13[3]._4_4_ = uVar26;
  in1_13[0]._4_4_ = uVar20;
  in1_13[0]._0_4_ = uVar19;
  in1_13[1]._0_4_ = uVar21;
  in1_13[1]._4_4_ = uVar22;
  in1_13[2]._0_4_ = uVar23;
  in1_13[2]._4_4_ = uVar24;
  in1_13[3]._0_4_ = uVar25;
  in1_13[3]._4_4_ = size;
  addsub_avx2(in0_13,in1_13,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_14[0]._4_4_ = uVar3;
  in0_14[0]._0_4_ = uVar2;
  in0_14[1]._0_4_ = uVar4;
  in0_14[1]._4_4_ = uVar5;
  in0_14[2]._0_4_ = uVar6;
  in0_14[2]._4_4_ = uVar7;
  in0_14[3]._0_4_ = uVar8;
  in0_14[3]._4_4_ = uVar26;
  in1_14[0]._4_4_ = uVar20;
  in1_14[0]._0_4_ = uVar19;
  in1_14[1]._0_4_ = uVar21;
  in1_14[1]._4_4_ = uVar22;
  in1_14[2]._0_4_ = uVar23;
  in1_14[2]._4_4_ = uVar24;
  in1_14[3]._0_4_ = uVar25;
  in1_14[3]._4_4_ = size;
  addsub_avx2(in0_14,in1_14,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_15[0]._4_4_ = uVar3;
  in0_15[0]._0_4_ = uVar2;
  in0_15[1]._0_4_ = uVar4;
  in0_15[1]._4_4_ = uVar5;
  in0_15[2]._0_4_ = uVar6;
  in0_15[2]._4_4_ = uVar7;
  in0_15[3]._0_4_ = uVar8;
  in0_15[3]._4_4_ = uVar26;
  in1_15[0]._4_4_ = uVar20;
  in1_15[0]._0_4_ = uVar19;
  in1_15[1]._0_4_ = uVar21;
  in1_15[1]._4_4_ = uVar22;
  in1_15[2]._0_4_ = uVar23;
  in1_15[2]._4_4_ = uVar24;
  in1_15[3]._0_4_ = uVar25;
  in1_15[3]._4_4_ = size;
  addsub_avx2(in0_15,in1_15,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_16[0]._4_4_ = uVar3;
  in0_16[0]._0_4_ = uVar2;
  in0_16[1]._0_4_ = uVar4;
  in0_16[1]._4_4_ = uVar5;
  in0_16[2]._0_4_ = uVar6;
  in0_16[2]._4_4_ = uVar7;
  in0_16[3]._0_4_ = uVar8;
  in0_16[3]._4_4_ = uVar26;
  in1_16[0]._4_4_ = uVar20;
  in1_16[0]._0_4_ = uVar19;
  in1_16[1]._0_4_ = uVar21;
  in1_16[1]._4_4_ = uVar22;
  in1_16[2]._0_4_ = uVar23;
  in1_16[2]._4_4_ = uVar24;
  in1_16[3]._0_4_ = uVar25;
  in1_16[3]._4_4_ = size;
  addsub_avx2(in0_16,in1_16,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_17[0]._4_4_ = uVar3;
  in0_17[0]._0_4_ = uVar2;
  in0_17[1]._0_4_ = uVar4;
  in0_17[1]._4_4_ = uVar5;
  in0_17[2]._0_4_ = uVar6;
  in0_17[2]._4_4_ = uVar7;
  in0_17[3]._0_4_ = uVar8;
  in0_17[3]._4_4_ = uVar26;
  in1_17[0]._4_4_ = uVar20;
  in1_17[0]._0_4_ = uVar19;
  in1_17[1]._0_4_ = uVar21;
  in1_17[1]._4_4_ = uVar22;
  in1_17[2]._0_4_ = uVar23;
  in1_17[2]._4_4_ = uVar24;
  in1_17[3]._0_4_ = uVar25;
  in1_17[3]._4_4_ = size;
  addsub_avx2(in0_17,in1_17,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_18[0]._4_4_ = uVar3;
  in0_18[0]._0_4_ = uVar2;
  in0_18[1]._0_4_ = uVar4;
  in0_18[1]._4_4_ = uVar5;
  in0_18[2]._0_4_ = uVar6;
  in0_18[2]._4_4_ = uVar7;
  in0_18[3]._0_4_ = uVar8;
  in0_18[3]._4_4_ = uVar26;
  in1_18[0]._4_4_ = uVar20;
  in1_18[0]._0_4_ = uVar19;
  in1_18[1]._0_4_ = uVar21;
  in1_18[1]._4_4_ = uVar22;
  in1_18[2]._0_4_ = uVar23;
  in1_18[2]._4_4_ = uVar24;
  in1_18[3]._0_4_ = uVar25;
  in1_18[3]._4_4_ = size;
  addsub_avx2(in0_18,in1_18,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_19[0]._4_4_ = uVar3;
  in0_19[0]._0_4_ = uVar2;
  in0_19[1]._0_4_ = uVar4;
  in0_19[1]._4_4_ = uVar5;
  in0_19[2]._0_4_ = uVar6;
  in0_19[2]._4_4_ = uVar7;
  in0_19[3]._0_4_ = uVar8;
  in0_19[3]._4_4_ = uVar26;
  in1_19[0]._4_4_ = uVar20;
  in1_19[0]._0_4_ = uVar19;
  in1_19[1]._0_4_ = uVar21;
  in1_19[1]._4_4_ = uVar22;
  in1_19[2]._0_4_ = uVar23;
  in1_19[2]._4_4_ = uVar24;
  in1_19[3]._0_4_ = uVar25;
  in1_19[3]._4_4_ = size;
  addsub_avx2(in0_19,in1_19,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_20[0]._4_4_ = uVar3;
  in0_20[0]._0_4_ = uVar2;
  in0_20[1]._0_4_ = uVar4;
  in0_20[1]._4_4_ = uVar5;
  in0_20[2]._0_4_ = uVar6;
  in0_20[2]._4_4_ = uVar7;
  in0_20[3]._0_4_ = uVar8;
  in0_20[3]._4_4_ = uVar26;
  in1_20[0]._4_4_ = uVar20;
  in1_20[0]._0_4_ = uVar19;
  in1_20[1]._0_4_ = uVar21;
  in1_20[1]._4_4_ = uVar22;
  in1_20[2]._0_4_ = uVar23;
  in1_20[2]._4_4_ = uVar24;
  in1_20[3]._0_4_ = uVar25;
  in1_20[3]._4_4_ = size;
  addsub_avx2(in0_20,in1_20,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_21[0]._4_4_ = uVar3;
  in0_21[0]._0_4_ = uVar2;
  in0_21[1]._0_4_ = uVar4;
  in0_21[1]._4_4_ = uVar5;
  in0_21[2]._0_4_ = uVar6;
  in0_21[2]._4_4_ = uVar7;
  in0_21[3]._0_4_ = uVar8;
  in0_21[3]._4_4_ = uVar26;
  in1_21[0]._4_4_ = uVar20;
  in1_21[0]._0_4_ = uVar19;
  in1_21[1]._0_4_ = uVar21;
  in1_21[1]._4_4_ = uVar22;
  in1_21[2]._0_4_ = uVar23;
  in1_21[2]._4_4_ = uVar24;
  in1_21[3]._0_4_ = uVar25;
  in1_21[3]._4_4_ = size;
  addsub_avx2(in0_21,in1_21,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_22[0]._4_4_ = uVar3;
  in0_22[0]._0_4_ = uVar2;
  in0_22[1]._0_4_ = uVar4;
  in0_22[1]._4_4_ = uVar5;
  in0_22[2]._0_4_ = uVar6;
  in0_22[2]._4_4_ = uVar7;
  in0_22[3]._0_4_ = uVar8;
  in0_22[3]._4_4_ = uVar26;
  in1_22[0]._4_4_ = uVar20;
  in1_22[0]._0_4_ = uVar19;
  in1_22[1]._0_4_ = uVar21;
  in1_22[1]._4_4_ = uVar22;
  in1_22[2]._0_4_ = uVar23;
  in1_22[2]._4_4_ = uVar24;
  in1_22[3]._0_4_ = uVar25;
  in1_22[3]._4_4_ = size;
  addsub_avx2(in0_22,in1_22,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0_23[0]._4_4_ = uVar3;
  in0_23[0]._0_4_ = uVar2;
  in0_23[1]._0_4_ = uVar4;
  in0_23[1]._4_4_ = uVar5;
  in0_23[2]._0_4_ = uVar6;
  in0_23[2]._4_4_ = uVar7;
  in0_23[3]._0_4_ = uVar8;
  in0_23[3]._4_4_ = uVar26;
  in1_23[0]._4_4_ = uVar20;
  in1_23[0]._0_4_ = uVar19;
  in1_23[1]._0_4_ = uVar21;
  in1_23[1]._4_4_ = uVar22;
  in1_23[2]._0_4_ = uVar23;
  in1_23[2]._4_4_ = uVar24;
  in1_23[3]._0_4_ = uVar25;
  in1_23[3]._4_4_ = size;
  addsub_avx2(in0_23,in1_23,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_24[0]._4_4_ = uVar3;
  in0_24[0]._0_4_ = uVar2;
  in0_24[1]._0_4_ = uVar4;
  in0_24[1]._4_4_ = uVar5;
  in0_24[2]._0_4_ = uVar6;
  in0_24[2]._4_4_ = uVar7;
  in0_24[3]._0_4_ = uVar8;
  in0_24[3]._4_4_ = uVar26;
  in1_24[0]._4_4_ = uVar20;
  in1_24[0]._0_4_ = uVar19;
  in1_24[1]._0_4_ = uVar21;
  in1_24[1]._4_4_ = uVar22;
  in1_24[2]._0_4_ = uVar23;
  in1_24[2]._4_4_ = uVar24;
  in1_24[3]._0_4_ = uVar25;
  in1_24[3]._4_4_ = size;
  addsub_avx2(in0_24,in1_24,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_25[0]._4_4_ = uVar3;
  in0_25[0]._0_4_ = uVar2;
  in0_25[1]._0_4_ = uVar4;
  in0_25[1]._4_4_ = uVar5;
  in0_25[2]._0_4_ = uVar6;
  in0_25[2]._4_4_ = uVar7;
  in0_25[3]._0_4_ = uVar8;
  in0_25[3]._4_4_ = uVar26;
  in1_25[0]._4_4_ = uVar20;
  in1_25[0]._0_4_ = uVar19;
  in1_25[1]._0_4_ = uVar21;
  in1_25[1]._4_4_ = uVar22;
  in1_25[2]._0_4_ = uVar23;
  in1_25[2]._4_4_ = uVar24;
  in1_25[3]._0_4_ = uVar25;
  in1_25[3]._4_4_ = size;
  addsub_avx2(in0_25,in1_25,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_26[0]._4_4_ = uVar3;
  in0_26[0]._0_4_ = uVar2;
  in0_26[1]._0_4_ = uVar4;
  in0_26[1]._4_4_ = uVar5;
  in0_26[2]._0_4_ = uVar6;
  in0_26[2]._4_4_ = uVar7;
  in0_26[3]._0_4_ = uVar8;
  in0_26[3]._4_4_ = uVar26;
  in1_26[0]._4_4_ = uVar20;
  in1_26[0]._0_4_ = uVar19;
  in1_26[1]._0_4_ = uVar21;
  in1_26[1]._4_4_ = uVar22;
  in1_26[2]._0_4_ = uVar23;
  in1_26[2]._4_4_ = uVar24;
  in1_26[3]._0_4_ = uVar25;
  in1_26[3]._4_4_ = size;
  addsub_avx2(in0_26,in1_26,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0_27[0]._4_4_ = uVar3;
  in0_27[0]._0_4_ = uVar2;
  in0_27[1]._0_4_ = uVar4;
  in0_27[1]._4_4_ = uVar5;
  in0_27[2]._0_4_ = uVar6;
  in0_27[2]._4_4_ = uVar7;
  in0_27[3]._0_4_ = uVar8;
  in0_27[3]._4_4_ = uVar26;
  in1_27[0]._4_4_ = uVar20;
  in1_27[0]._0_4_ = uVar19;
  in1_27[1]._0_4_ = uVar21;
  in1_27[1]._4_4_ = uVar22;
  in1_27[2]._0_4_ = uVar23;
  in1_27[2]._4_4_ = uVar24;
  in1_27[3]._0_4_ = uVar25;
  in1_27[3]._4_4_ = size;
  addsub_avx2(in0_27,in1_27,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_28[0]._4_4_ = uVar3;
  in0_28[0]._0_4_ = uVar2;
  in0_28[1]._0_4_ = uVar4;
  in0_28[1]._4_4_ = uVar5;
  in0_28[2]._0_4_ = uVar6;
  in0_28[2]._4_4_ = uVar7;
  in0_28[3]._0_4_ = uVar8;
  in0_28[3]._4_4_ = uVar26;
  in1_28[0]._4_4_ = uVar20;
  in1_28[0]._0_4_ = uVar19;
  in1_28[1]._0_4_ = uVar21;
  in1_28[1]._4_4_ = uVar22;
  in1_28[2]._0_4_ = uVar23;
  in1_28[2]._4_4_ = uVar24;
  in1_28[3]._0_4_ = uVar25;
  in1_28[3]._4_4_ = size;
  addsub_avx2(in0_28,in1_28,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_29[0]._4_4_ = uVar3;
  in0_29[0]._0_4_ = uVar2;
  in0_29[1]._0_4_ = uVar4;
  in0_29[1]._4_4_ = uVar5;
  in0_29[2]._0_4_ = uVar6;
  in0_29[2]._4_4_ = uVar7;
  in0_29[3]._0_4_ = uVar8;
  in0_29[3]._4_4_ = uVar26;
  in1_29[0]._4_4_ = uVar20;
  in1_29[0]._0_4_ = uVar19;
  in1_29[1]._0_4_ = uVar21;
  in1_29[1]._4_4_ = uVar22;
  in1_29[2]._0_4_ = uVar23;
  in1_29[2]._4_4_ = uVar24;
  in1_29[3]._0_4_ = uVar25;
  in1_29[3]._4_4_ = size;
  addsub_avx2(in0_29,in1_29,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_30[0]._4_4_ = uVar3;
  in0_30[0]._0_4_ = uVar2;
  in0_30[1]._0_4_ = uVar4;
  in0_30[1]._4_4_ = uVar5;
  in0_30[2]._0_4_ = uVar6;
  in0_30[2]._4_4_ = uVar7;
  in0_30[3]._0_4_ = uVar8;
  in0_30[3]._4_4_ = uVar26;
  in1_30[0]._4_4_ = uVar20;
  in1_30[0]._0_4_ = uVar19;
  in1_30[1]._0_4_ = uVar21;
  in1_30[1]._4_4_ = uVar22;
  in1_30[2]._0_4_ = uVar23;
  in1_30[2]._4_4_ = uVar24;
  in1_30[3]._0_4_ = uVar25;
  in1_30[3]._4_4_ = size;
  addsub_avx2(in0_30,in1_30,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0_31[0]._4_4_ = uVar3;
  in0_31[0]._0_4_ = uVar2;
  in0_31[1]._0_4_ = uVar4;
  in0_31[1]._4_4_ = uVar5;
  in0_31[2]._0_4_ = uVar6;
  in0_31[2]._4_4_ = uVar7;
  in0_31[3]._0_4_ = uVar8;
  in0_31[3]._4_4_ = uVar26;
  in1_31[0]._4_4_ = uVar20;
  in1_31[0]._0_4_ = uVar19;
  in1_31[1]._0_4_ = uVar21;
  in1_31[1]._4_4_ = uVar22;
  in1_31[2]._0_4_ = uVar23;
  in1_31[2]._4_4_ = uVar24;
  in1_31[3]._0_4_ = uVar25;
  in1_31[3]._4_4_ = size;
  addsub_avx2(in0_31,in1_31,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_32[0]._4_4_ = uVar3;
  in0_32[0]._0_4_ = uVar2;
  in0_32[1]._0_4_ = uVar4;
  in0_32[1]._4_4_ = uVar5;
  in0_32[2]._0_4_ = uVar6;
  in0_32[2]._4_4_ = uVar7;
  in0_32[3]._0_4_ = uVar8;
  in0_32[3]._4_4_ = uVar26;
  in1_32[0]._4_4_ = uVar20;
  in1_32[0]._0_4_ = uVar19;
  in1_32[1]._0_4_ = uVar21;
  in1_32[1]._4_4_ = uVar22;
  in1_32[2]._0_4_ = uVar23;
  in1_32[2]._4_4_ = uVar24;
  in1_32[3]._0_4_ = uVar25;
  in1_32[3]._4_4_ = size;
  addsub_avx2(in0_32,in1_32,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_33[0]._4_4_ = uVar3;
  in0_33[0]._0_4_ = uVar2;
  in0_33[1]._0_4_ = uVar4;
  in0_33[1]._4_4_ = uVar5;
  in0_33[2]._0_4_ = uVar6;
  in0_33[2]._4_4_ = uVar7;
  in0_33[3]._0_4_ = uVar8;
  in0_33[3]._4_4_ = uVar26;
  in1_33[0]._4_4_ = uVar20;
  in1_33[0]._0_4_ = uVar19;
  in1_33[1]._0_4_ = uVar21;
  in1_33[1]._4_4_ = uVar22;
  in1_33[2]._0_4_ = uVar23;
  in1_33[2]._4_4_ = uVar24;
  in1_33[3]._0_4_ = uVar25;
  in1_33[3]._4_4_ = size;
  addsub_avx2(in0_33,in1_33,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_34[0]._4_4_ = uVar3;
  in0_34[0]._0_4_ = uVar2;
  in0_34[1]._0_4_ = uVar4;
  in0_34[1]._4_4_ = uVar5;
  in0_34[2]._0_4_ = uVar6;
  in0_34[2]._4_4_ = uVar7;
  in0_34[3]._0_4_ = uVar8;
  in0_34[3]._4_4_ = uVar26;
  in1_34[0]._4_4_ = uVar20;
  in1_34[0]._0_4_ = uVar19;
  in1_34[1]._0_4_ = uVar21;
  in1_34[1]._4_4_ = uVar22;
  in1_34[2]._0_4_ = uVar23;
  in1_34[2]._4_4_ = uVar24;
  in1_34[3]._0_4_ = uVar25;
  in1_34[3]._4_4_ = size;
  addsub_avx2(in0_34,in1_34,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_35[0]._4_4_ = uVar3;
  in0_35[0]._0_4_ = uVar2;
  in0_35[1]._0_4_ = uVar4;
  in0_35[1]._4_4_ = uVar5;
  in0_35[2]._0_4_ = uVar6;
  in0_35[2]._4_4_ = uVar7;
  in0_35[3]._0_4_ = uVar8;
  in0_35[3]._4_4_ = uVar26;
  in1_35[0]._4_4_ = uVar20;
  in1_35[0]._0_4_ = uVar19;
  in1_35[1]._0_4_ = uVar21;
  in1_35[1]._4_4_ = uVar22;
  in1_35[2]._0_4_ = uVar23;
  in1_35[2]._4_4_ = uVar24;
  in1_35[3]._0_4_ = uVar25;
  in1_35[3]._4_4_ = size;
  addsub_avx2(in0_35,in1_35,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_36[0]._4_4_ = uVar3;
  in0_36[0]._0_4_ = uVar2;
  in0_36[1]._0_4_ = uVar4;
  in0_36[1]._4_4_ = uVar5;
  in0_36[2]._0_4_ = uVar6;
  in0_36[2]._4_4_ = uVar7;
  in0_36[3]._0_4_ = uVar8;
  in0_36[3]._4_4_ = uVar26;
  in1_36[0]._4_4_ = uVar20;
  in1_36[0]._0_4_ = uVar19;
  in1_36[1]._0_4_ = uVar21;
  in1_36[1]._4_4_ = uVar22;
  in1_36[2]._0_4_ = uVar23;
  in1_36[2]._4_4_ = uVar24;
  in1_36[3]._0_4_ = uVar25;
  in1_36[3]._4_4_ = size;
  addsub_avx2(in0_36,in1_36,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_37[0]._4_4_ = uVar3;
  in0_37[0]._0_4_ = uVar2;
  in0_37[1]._0_4_ = uVar4;
  in0_37[1]._4_4_ = uVar5;
  in0_37[2]._0_4_ = uVar6;
  in0_37[2]._4_4_ = uVar7;
  in0_37[3]._0_4_ = uVar8;
  in0_37[3]._4_4_ = uVar26;
  in1_37[0]._4_4_ = uVar20;
  in1_37[0]._0_4_ = uVar19;
  in1_37[1]._0_4_ = uVar21;
  in1_37[1]._4_4_ = uVar22;
  in1_37[2]._0_4_ = uVar23;
  in1_37[2]._4_4_ = uVar24;
  in1_37[3]._0_4_ = uVar25;
  in1_37[3]._4_4_ = size;
  addsub_avx2(in0_37,in1_37,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_38[0]._4_4_ = uVar3;
  in0_38[0]._0_4_ = uVar2;
  in0_38[1]._0_4_ = uVar4;
  in0_38[1]._4_4_ = uVar5;
  in0_38[2]._0_4_ = uVar6;
  in0_38[2]._4_4_ = uVar7;
  in0_38[3]._0_4_ = uVar8;
  in0_38[3]._4_4_ = uVar26;
  in1_38[0]._4_4_ = uVar20;
  in1_38[0]._0_4_ = uVar19;
  in1_38[1]._0_4_ = uVar21;
  in1_38[1]._4_4_ = uVar22;
  in1_38[2]._0_4_ = uVar23;
  in1_38[2]._4_4_ = uVar24;
  in1_38[3]._0_4_ = uVar25;
  in1_38[3]._4_4_ = size;
  addsub_avx2(in0_38,in1_38,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_39[0]._4_4_ = uVar3;
  in0_39[0]._0_4_ = uVar2;
  in0_39[1]._0_4_ = uVar4;
  in0_39[1]._4_4_ = uVar5;
  in0_39[2]._0_4_ = uVar6;
  in0_39[2]._4_4_ = uVar7;
  in0_39[3]._0_4_ = uVar8;
  in0_39[3]._4_4_ = uVar26;
  in1_39[0]._4_4_ = uVar20;
  in1_39[0]._0_4_ = uVar19;
  in1_39[1]._0_4_ = uVar21;
  in1_39[1]._4_4_ = uVar22;
  in1_39[2]._0_4_ = uVar23;
  in1_39[2]._4_4_ = uVar24;
  in1_39[3]._0_4_ = uVar25;
  in1_39[3]._4_4_ = size;
  addsub_avx2(in0_39,in1_39,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_40[0]._4_4_ = uVar3;
  in0_40[0]._0_4_ = uVar2;
  in0_40[1]._0_4_ = uVar4;
  in0_40[1]._4_4_ = uVar5;
  in0_40[2]._0_4_ = uVar6;
  in0_40[2]._4_4_ = uVar7;
  in0_40[3]._0_4_ = uVar8;
  in0_40[3]._4_4_ = uVar26;
  in1_40[0]._4_4_ = uVar20;
  in1_40[0]._0_4_ = uVar19;
  in1_40[1]._0_4_ = uVar21;
  in1_40[1]._4_4_ = uVar22;
  in1_40[2]._0_4_ = uVar23;
  in1_40[2]._4_4_ = uVar24;
  in1_40[3]._0_4_ = uVar25;
  in1_40[3]._4_4_ = size;
  addsub_avx2(in0_40,in1_40,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_41[0]._4_4_ = uVar3;
  in0_41[0]._0_4_ = uVar2;
  in0_41[1]._0_4_ = uVar4;
  in0_41[1]._4_4_ = uVar5;
  in0_41[2]._0_4_ = uVar6;
  in0_41[2]._4_4_ = uVar7;
  in0_41[3]._0_4_ = uVar8;
  in0_41[3]._4_4_ = uVar26;
  in1_41[0]._4_4_ = uVar20;
  in1_41[0]._0_4_ = uVar19;
  in1_41[1]._0_4_ = uVar21;
  in1_41[1]._4_4_ = uVar22;
  in1_41[2]._0_4_ = uVar23;
  in1_41[2]._4_4_ = uVar24;
  in1_41[3]._0_4_ = uVar25;
  in1_41[3]._4_4_ = size;
  addsub_avx2(in0_41,in1_41,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_42[0]._4_4_ = uVar3;
  in0_42[0]._0_4_ = uVar2;
  in0_42[1]._0_4_ = uVar4;
  in0_42[1]._4_4_ = uVar5;
  in0_42[2]._0_4_ = uVar6;
  in0_42[2]._4_4_ = uVar7;
  in0_42[3]._0_4_ = uVar8;
  in0_42[3]._4_4_ = uVar26;
  in1_42[0]._4_4_ = uVar20;
  in1_42[0]._0_4_ = uVar19;
  in1_42[1]._0_4_ = uVar21;
  in1_42[1]._4_4_ = uVar22;
  in1_42[2]._0_4_ = uVar23;
  in1_42[2]._4_4_ = uVar24;
  in1_42[3]._0_4_ = uVar25;
  in1_42[3]._4_4_ = size;
  addsub_avx2(in0_42,in1_42,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_43[0]._4_4_ = uVar3;
  in0_43[0]._0_4_ = uVar2;
  in0_43[1]._0_4_ = uVar4;
  in0_43[1]._4_4_ = uVar5;
  in0_43[2]._0_4_ = uVar6;
  in0_43[2]._4_4_ = uVar7;
  in0_43[3]._0_4_ = uVar8;
  in0_43[3]._4_4_ = uVar26;
  in1_43[0]._4_4_ = uVar20;
  in1_43[0]._0_4_ = uVar19;
  in1_43[1]._0_4_ = uVar21;
  in1_43[1]._4_4_ = uVar22;
  in1_43[2]._0_4_ = uVar23;
  in1_43[2]._4_4_ = uVar24;
  in1_43[3]._0_4_ = uVar25;
  in1_43[3]._4_4_ = size;
  addsub_avx2(in0_43,in1_43,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_44[0]._4_4_ = uVar3;
  in0_44[0]._0_4_ = uVar2;
  in0_44[1]._0_4_ = uVar4;
  in0_44[1]._4_4_ = uVar5;
  in0_44[2]._0_4_ = uVar6;
  in0_44[2]._4_4_ = uVar7;
  in0_44[3]._0_4_ = uVar8;
  in0_44[3]._4_4_ = uVar26;
  in1_44[0]._4_4_ = uVar20;
  in1_44[0]._0_4_ = uVar19;
  in1_44[1]._0_4_ = uVar21;
  in1_44[1]._4_4_ = uVar22;
  in1_44[2]._0_4_ = uVar23;
  in1_44[2]._4_4_ = uVar24;
  in1_44[3]._0_4_ = uVar25;
  in1_44[3]._4_4_ = size;
  addsub_avx2(in0_44,in1_44,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_45[0]._4_4_ = uVar3;
  in0_45[0]._0_4_ = uVar2;
  in0_45[1]._0_4_ = uVar4;
  in0_45[1]._4_4_ = uVar5;
  in0_45[2]._0_4_ = uVar6;
  in0_45[2]._4_4_ = uVar7;
  in0_45[3]._0_4_ = uVar8;
  in0_45[3]._4_4_ = uVar26;
  in1_45[0]._4_4_ = uVar20;
  in1_45[0]._0_4_ = uVar19;
  in1_45[1]._0_4_ = uVar21;
  in1_45[1]._4_4_ = uVar22;
  in1_45[2]._0_4_ = uVar23;
  in1_45[2]._4_4_ = uVar24;
  in1_45[3]._0_4_ = uVar25;
  in1_45[3]._4_4_ = size;
  addsub_avx2(in0_45,in1_45,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_46[0]._4_4_ = uVar3;
  in0_46[0]._0_4_ = uVar2;
  in0_46[1]._0_4_ = uVar4;
  in0_46[1]._4_4_ = uVar5;
  in0_46[2]._0_4_ = uVar6;
  in0_46[2]._4_4_ = uVar7;
  in0_46[3]._0_4_ = uVar8;
  in0_46[3]._4_4_ = uVar26;
  in1_46[0]._4_4_ = uVar20;
  in1_46[0]._0_4_ = uVar19;
  in1_46[1]._0_4_ = uVar21;
  in1_46[1]._4_4_ = uVar22;
  in1_46[2]._0_4_ = uVar23;
  in1_46[2]._4_4_ = uVar24;
  in1_46[3]._0_4_ = uVar25;
  in1_46[3]._4_4_ = size;
  addsub_avx2(in0_46,in1_46,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(size,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),
                (__m256i *)CONCAT44(uVar22,uVar21),(__m256i *)CONCAT44(uVar20,uVar19),
                (__m256i *)CONCAT44(uVar18,uVar17),bit_00);
  in0_47[0]._4_4_ = uVar3;
  in0_47[0]._0_4_ = uVar2;
  in0_47[1]._0_4_ = uVar4;
  in0_47[1]._4_4_ = uVar5;
  in0_47[2]._0_4_ = uVar6;
  in0_47[2]._4_4_ = uVar7;
  in0_47[3]._0_4_ = uVar8;
  in0_47[3]._4_4_ = uVar26;
  in1_47[0]._4_4_ = uVar20;
  in1_47[0]._0_4_ = uVar19;
  in1_47[1]._0_4_ = uVar21;
  in1_47[1]._4_4_ = uVar22;
  in1_47[2]._0_4_ = uVar23;
  in1_47[2]._4_4_ = uVar24;
  in1_47[3]._0_4_ = uVar25;
  in1_47[3]._4_4_ = size;
  addsub_avx2(in0_47,in1_47,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_48[0]._4_4_ = uVar3;
  in0_48[0]._0_4_ = uVar2;
  in0_48[1]._0_4_ = uVar4;
  in0_48[1]._4_4_ = uVar5;
  in0_48[2]._0_4_ = uVar6;
  in0_48[2]._4_4_ = uVar7;
  in0_48[3]._0_4_ = uVar8;
  in0_48[3]._4_4_ = uVar26;
  in1_48[0]._4_4_ = uVar20;
  in1_48[0]._0_4_ = uVar19;
  in1_48[1]._0_4_ = uVar21;
  in1_48[1]._4_4_ = uVar22;
  in1_48[2]._0_4_ = uVar23;
  in1_48[2]._4_4_ = uVar24;
  in1_48[3]._0_4_ = uVar25;
  in1_48[3]._4_4_ = size;
  addsub_avx2(in0_48,in1_48,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_49[0]._4_4_ = uVar3;
  in0_49[0]._0_4_ = uVar2;
  in0_49[1]._0_4_ = uVar4;
  in0_49[1]._4_4_ = uVar5;
  in0_49[2]._0_4_ = uVar6;
  in0_49[2]._4_4_ = uVar7;
  in0_49[3]._0_4_ = uVar8;
  in0_49[3]._4_4_ = uVar26;
  in1_49[0]._4_4_ = uVar20;
  in1_49[0]._0_4_ = uVar19;
  in1_49[1]._0_4_ = uVar21;
  in1_49[1]._4_4_ = uVar22;
  in1_49[2]._0_4_ = uVar23;
  in1_49[2]._4_4_ = uVar24;
  in1_49[3]._0_4_ = uVar25;
  in1_49[3]._4_4_ = size;
  addsub_avx2(in0_49,in1_49,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_50[0]._4_4_ = uVar3;
  in0_50[0]._0_4_ = uVar2;
  in0_50[1]._0_4_ = uVar4;
  in0_50[1]._4_4_ = uVar5;
  in0_50[2]._0_4_ = uVar6;
  in0_50[2]._4_4_ = uVar7;
  in0_50[3]._0_4_ = uVar8;
  in0_50[3]._4_4_ = uVar26;
  in1_50[0]._4_4_ = uVar20;
  in1_50[0]._0_4_ = uVar19;
  in1_50[1]._0_4_ = uVar21;
  in1_50[1]._4_4_ = uVar22;
  in1_50[2]._0_4_ = uVar23;
  in1_50[2]._4_4_ = uVar24;
  in1_50[3]._0_4_ = uVar25;
  in1_50[3]._4_4_ = size;
  addsub_avx2(in0_50,in1_50,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_51[0]._4_4_ = uVar3;
  in0_51[0]._0_4_ = uVar2;
  in0_51[1]._0_4_ = uVar4;
  in0_51[1]._4_4_ = uVar5;
  in0_51[2]._0_4_ = uVar6;
  in0_51[2]._4_4_ = uVar7;
  in0_51[3]._0_4_ = uVar8;
  in0_51[3]._4_4_ = uVar26;
  in1_51[0]._4_4_ = uVar20;
  in1_51[0]._0_4_ = uVar19;
  in1_51[1]._0_4_ = uVar21;
  in1_51[1]._4_4_ = uVar22;
  in1_51[2]._0_4_ = uVar23;
  in1_51[2]._4_4_ = uVar24;
  in1_51[3]._0_4_ = uVar25;
  in1_51[3]._4_4_ = size;
  addsub_avx2(in0_51,in1_51,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_52[0]._4_4_ = uVar3;
  in0_52[0]._0_4_ = uVar2;
  in0_52[1]._0_4_ = uVar4;
  in0_52[1]._4_4_ = uVar5;
  in0_52[2]._0_4_ = uVar6;
  in0_52[2]._4_4_ = uVar7;
  in0_52[3]._0_4_ = uVar8;
  in0_52[3]._4_4_ = uVar26;
  in1_52[0]._4_4_ = uVar20;
  in1_52[0]._0_4_ = uVar19;
  in1_52[1]._0_4_ = uVar21;
  in1_52[1]._4_4_ = uVar22;
  in1_52[2]._0_4_ = uVar23;
  in1_52[2]._4_4_ = uVar24;
  in1_52[3]._0_4_ = uVar25;
  in1_52[3]._4_4_ = size;
  addsub_avx2(in0_52,in1_52,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_53[0]._4_4_ = uVar3;
  in0_53[0]._0_4_ = uVar2;
  in0_53[1]._0_4_ = uVar4;
  in0_53[1]._4_4_ = uVar5;
  in0_53[2]._0_4_ = uVar6;
  in0_53[2]._4_4_ = uVar7;
  in0_53[3]._0_4_ = uVar8;
  in0_53[3]._4_4_ = uVar26;
  in1_53[0]._4_4_ = uVar20;
  in1_53[0]._0_4_ = uVar19;
  in1_53[1]._0_4_ = uVar21;
  in1_53[1]._4_4_ = uVar22;
  in1_53[2]._0_4_ = uVar23;
  in1_53[2]._4_4_ = uVar24;
  in1_53[3]._0_4_ = uVar25;
  in1_53[3]._4_4_ = size;
  addsub_avx2(in0_53,in1_53,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_54[0]._4_4_ = uVar3;
  in0_54[0]._0_4_ = uVar2;
  in0_54[1]._0_4_ = uVar4;
  in0_54[1]._4_4_ = uVar5;
  in0_54[2]._0_4_ = uVar6;
  in0_54[2]._4_4_ = uVar7;
  in0_54[3]._0_4_ = uVar8;
  in0_54[3]._4_4_ = uVar26;
  in1_54[0]._4_4_ = uVar20;
  in1_54[0]._0_4_ = uVar19;
  in1_54[1]._0_4_ = uVar21;
  in1_54[1]._4_4_ = uVar22;
  in1_54[2]._0_4_ = uVar23;
  in1_54[2]._4_4_ = uVar24;
  in1_54[3]._0_4_ = uVar25;
  in1_54[3]._4_4_ = size;
  addsub_avx2(in0_54,in1_54,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_55[0]._4_4_ = uVar3;
  in0_55[0]._0_4_ = uVar2;
  in0_55[1]._0_4_ = uVar4;
  in0_55[1]._4_4_ = uVar5;
  in0_55[2]._0_4_ = uVar6;
  in0_55[2]._4_4_ = uVar7;
  in0_55[3]._0_4_ = uVar8;
  in0_55[3]._4_4_ = uVar26;
  in1_55[0]._4_4_ = uVar20;
  in1_55[0]._0_4_ = uVar19;
  in1_55[1]._0_4_ = uVar21;
  in1_55[1]._4_4_ = uVar22;
  in1_55[2]._0_4_ = uVar23;
  in1_55[2]._4_4_ = uVar24;
  in1_55[3]._0_4_ = uVar25;
  in1_55[3]._4_4_ = size;
  addsub_avx2(in0_55,in1_55,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_56[0]._4_4_ = uVar3;
  in0_56[0]._0_4_ = uVar2;
  in0_56[1]._0_4_ = uVar4;
  in0_56[1]._4_4_ = uVar5;
  in0_56[2]._0_4_ = uVar6;
  in0_56[2]._4_4_ = uVar7;
  in0_56[3]._0_4_ = uVar8;
  in0_56[3]._4_4_ = uVar26;
  in1_56[0]._4_4_ = uVar20;
  in1_56[0]._0_4_ = uVar19;
  in1_56[1]._0_4_ = uVar21;
  in1_56[1]._4_4_ = uVar22;
  in1_56[2]._0_4_ = uVar23;
  in1_56[2]._4_4_ = uVar24;
  in1_56[3]._0_4_ = uVar25;
  in1_56[3]._4_4_ = size;
  addsub_avx2(in0_56,in1_56,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_57[0]._4_4_ = uVar3;
  in0_57[0]._0_4_ = uVar2;
  in0_57[1]._0_4_ = uVar4;
  in0_57[1]._4_4_ = uVar5;
  in0_57[2]._0_4_ = uVar6;
  in0_57[2]._4_4_ = uVar7;
  in0_57[3]._0_4_ = uVar8;
  in0_57[3]._4_4_ = uVar26;
  in1_57[0]._4_4_ = uVar20;
  in1_57[0]._0_4_ = uVar19;
  in1_57[1]._0_4_ = uVar21;
  in1_57[1]._4_4_ = uVar22;
  in1_57[2]._0_4_ = uVar23;
  in1_57[2]._4_4_ = uVar24;
  in1_57[3]._0_4_ = uVar25;
  in1_57[3]._4_4_ = size;
  addsub_avx2(in0_57,in1_57,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_58[0]._4_4_ = uVar3;
  in0_58[0]._0_4_ = uVar2;
  in0_58[1]._0_4_ = uVar4;
  in0_58[1]._4_4_ = uVar5;
  in0_58[2]._0_4_ = uVar6;
  in0_58[2]._4_4_ = uVar7;
  in0_58[3]._0_4_ = uVar8;
  in0_58[3]._4_4_ = uVar26;
  in1_58[0]._4_4_ = uVar20;
  in1_58[0]._0_4_ = uVar19;
  in1_58[1]._0_4_ = uVar21;
  in1_58[1]._4_4_ = uVar22;
  in1_58[2]._0_4_ = uVar23;
  in1_58[2]._4_4_ = uVar24;
  in1_58[3]._0_4_ = uVar25;
  in1_58[3]._4_4_ = size;
  addsub_avx2(in0_58,in1_58,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_59[0]._4_4_ = uVar3;
  in0_59[0]._0_4_ = uVar2;
  in0_59[1]._0_4_ = uVar4;
  in0_59[1]._4_4_ = uVar5;
  in0_59[2]._0_4_ = uVar6;
  in0_59[2]._4_4_ = uVar7;
  in0_59[3]._0_4_ = uVar8;
  in0_59[3]._4_4_ = uVar26;
  in1_59[0]._4_4_ = uVar20;
  in1_59[0]._0_4_ = uVar19;
  in1_59[1]._0_4_ = uVar21;
  in1_59[1]._4_4_ = uVar22;
  in1_59[2]._0_4_ = uVar23;
  in1_59[2]._4_4_ = uVar24;
  in1_59[3]._0_4_ = uVar25;
  in1_59[3]._4_4_ = size;
  addsub_avx2(in0_59,in1_59,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_60[0]._4_4_ = uVar3;
  in0_60[0]._0_4_ = uVar2;
  in0_60[1]._0_4_ = uVar4;
  in0_60[1]._4_4_ = uVar5;
  in0_60[2]._0_4_ = uVar6;
  in0_60[2]._4_4_ = uVar7;
  in0_60[3]._0_4_ = uVar8;
  in0_60[3]._4_4_ = uVar26;
  in1_60[0]._4_4_ = uVar20;
  in1_60[0]._0_4_ = uVar19;
  in1_60[1]._0_4_ = uVar21;
  in1_60[1]._4_4_ = uVar22;
  in1_60[2]._0_4_ = uVar23;
  in1_60[2]._4_4_ = uVar24;
  in1_60[3]._0_4_ = uVar25;
  in1_60[3]._4_4_ = size;
  addsub_avx2(in0_60,in1_60,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_61[0]._4_4_ = uVar3;
  in0_61[0]._0_4_ = uVar2;
  in0_61[1]._0_4_ = uVar4;
  in0_61[1]._4_4_ = uVar5;
  in0_61[2]._0_4_ = uVar6;
  in0_61[2]._4_4_ = uVar7;
  in0_61[3]._0_4_ = uVar8;
  in0_61[3]._4_4_ = uVar26;
  in1_61[0]._4_4_ = uVar20;
  in1_61[0]._0_4_ = uVar19;
  in1_61[1]._0_4_ = uVar21;
  in1_61[1]._4_4_ = uVar22;
  in1_61[2]._0_4_ = uVar23;
  in1_61[2]._4_4_ = uVar24;
  in1_61[3]._0_4_ = uVar25;
  in1_61[3]._4_4_ = size;
  addsub_avx2(in0_61,in1_61,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  in0_62[0]._4_4_ = uVar3;
  in0_62[0]._0_4_ = uVar2;
  in0_62[1]._0_4_ = uVar4;
  in0_62[1]._4_4_ = uVar5;
  in0_62[2]._0_4_ = uVar6;
  in0_62[2]._4_4_ = uVar7;
  in0_62[3]._0_4_ = uVar8;
  in0_62[3]._4_4_ = uVar26;
  in1_62[0]._4_4_ = uVar20;
  in1_62[0]._0_4_ = uVar19;
  in1_62[1]._0_4_ = uVar21;
  in1_62[1]._4_4_ = uVar22;
  in1_62[2]._0_4_ = uVar23;
  in1_62[2]._4_4_ = uVar24;
  in1_62[3]._0_4_ = uVar25;
  in1_62[3]._4_4_ = size;
  addsub_avx2(in0_62,in1_62,(__m256i *)CONCAT44(uVar18,uVar17),(__m256i *)CONCAT44(bit_00,uVar16),
              (__m256i *)CONCAT44(uVar15,uVar14),(__m256i *)CONCAT44(uVar13,uVar12));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_1f1c = '\x10';
    }
    else {
      local_1f1c = (char)in_R8D + '\x06';
    }
    uVar12 = -(1 << (local_1f1c - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    vpinsrd_avx(auVar1,uVar12,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    vpinsrd_avx(auVar1,uVar12,3);
    uVar12 = (1 << (local_1f1c - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    vpinsrd_avx(auVar1,uVar12,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
    auVar1 = vpinsrd_avx(auVar1,uVar12,2);
    vpinsrd_avx(auVar1,uVar12,3);
    round_shift_8x8_avx2(in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c4);
    round_shift_8x8_avx2(in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c4);
    highbd_clamp_epi32_avx2
              ((__m256i *)CONCAT44(uVar26,uVar8),(__m256i *)CONCAT44(uVar7,uVar6),
               (__m256i *)CONCAT44(uVar5,uVar4),(__m256i *)CONCAT44(uVar3,uVar2),size);
  }
  return;
}

Assistant:

static void idct32_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  __m256i cospi_p62_m02 = pair_set_w16_epi16(cospi[62], -cospi[2]);
  __m256i cospi_p02_p62 = pair_set_w16_epi16(cospi[2], cospi[62]);
  __m256i cospi_p30_m34 = pair_set_w16_epi16(cospi[30], -cospi[34]);
  __m256i cospi_p34_p30 = pair_set_w16_epi16(cospi[34], cospi[30]);
  __m256i cospi_p46_m18 = pair_set_w16_epi16(cospi[46], -cospi[18]);
  __m256i cospi_p18_p46 = pair_set_w16_epi16(cospi[18], cospi[46]);
  __m256i cospi_p14_m50 = pair_set_w16_epi16(cospi[14], -cospi[50]);
  __m256i cospi_p50_p14 = pair_set_w16_epi16(cospi[50], cospi[14]);
  __m256i cospi_p54_m10 = pair_set_w16_epi16(cospi[54], -cospi[10]);
  __m256i cospi_p10_p54 = pair_set_w16_epi16(cospi[10], cospi[54]);
  __m256i cospi_p22_m42 = pair_set_w16_epi16(cospi[22], -cospi[42]);
  __m256i cospi_p42_p22 = pair_set_w16_epi16(cospi[42], cospi[22]);
  __m256i cospi_p38_m26 = pair_set_w16_epi16(cospi[38], -cospi[26]);
  __m256i cospi_p26_p38 = pair_set_w16_epi16(cospi[26], cospi[38]);
  __m256i cospi_p06_m58 = pair_set_w16_epi16(cospi[6], -cospi[58]);
  __m256i cospi_p58_p06 = pair_set_w16_epi16(cospi[58], cospi[6]);
  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p56_m08 = pair_set_w16_epi16(cospi[56], -cospi[8]);
  __m256i cospi_p08_p56 = pair_set_w16_epi16(cospi[8], cospi[56]);
  __m256i cospi_p24_m40 = pair_set_w16_epi16(cospi[24], -cospi[40]);
  __m256i cospi_p40_p24 = pair_set_w16_epi16(cospi[40], cospi[24]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);

  // stage 1
  __m256i x1[32];
  x1[0] = input[0];
  x1[1] = input[16];
  x1[2] = input[8];
  x1[3] = input[24];
  x1[4] = input[4];
  x1[5] = input[20];
  x1[6] = input[12];
  x1[7] = input[28];
  x1[8] = input[2];
  x1[9] = input[18];
  x1[10] = input[10];
  x1[11] = input[26];
  x1[12] = input[6];
  x1[13] = input[22];
  x1[14] = input[14];
  x1[15] = input[30];
  x1[16] = input[1];
  x1[17] = input[17];
  x1[18] = input[9];
  x1[19] = input[25];
  x1[20] = input[5];
  x1[21] = input[21];
  x1[22] = input[13];
  x1[23] = input[29];
  x1[24] = input[3];
  x1[25] = input[19];
  x1[26] = input[11];
  x1[27] = input[27];
  x1[28] = input[7];
  x1[29] = input[23];
  x1[30] = input[15];
  x1[31] = input[31];

  // stage 2
  btf_16_w16_avx2(cospi_p62_m02, cospi_p02_p62, &x1[16], &x1[31], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p30_m34, cospi_p34_p30, &x1[17], &x1[30], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p46_m18, cospi_p18_p46, &x1[18], &x1[29], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p14_m50, cospi_p50_p14, &x1[19], &x1[28], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p54_m10, cospi_p10_p54, &x1[20], &x1[27], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p22_m42, cospi_p42_p22, &x1[21], &x1[26], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p38_m26, cospi_p26_p38, &x1[22], &x1[25], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p06_m58, cospi_p58_p06, &x1[23], &x1[24], _r,
                  INV_COS_BIT);

  // stage 3
  btf_16_w16_avx2(cospi_p60_m04, cospi_p04_p60, &x1[8], &x1[15], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p28_m36, cospi_p36_p28, &x1[9], &x1[14], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p44_m20, cospi_p20_p44, &x1[10], &x1[13], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p12_m52, cospi_p52_p12, &x1[11], &x1[12], _r,
                  INV_COS_BIT);
  idct32_high16_stage3_avx2(x1);

  // stage 4
  btf_16_w16_avx2(cospi_p56_m08, cospi_p08_p56, &x1[4], &x1[7], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p24_m40, cospi_p40_p24, &x1[5], &x1[6], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);
  idct32_high16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 5
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r,
                  INV_COS_BIT);
  btf_16_w16_avx2(cospi_p48_m16, cospi_p16_p48, &x1[2], &x1[3], _r,
                  INV_COS_BIT);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  idct32_high24_stage5_avx2(x1, cospi, _r, INV_COS_BIT);

  // stage 6
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  idct32_high28_stage6_avx2(x1, cospi, _r, INV_COS_BIT);

  idct32_stage7_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  idct32_stage9_avx2(output, x1);
}